

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateZeroInitialize(ExpressionEvalContext *ctx,ExprZeroInitialize *expression)

{
  _func_int **__s;
  Allocator *pAVar1;
  SynBase *pSVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  TypeBase *pTVar5;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pTVar5 = expression->address->type;
    if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
      pTVar5 = (TypeBase *)0x0;
    }
    if (pTVar5 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x6f9,
                    "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                   );
    }
    pEVar4 = Evaluate(ctx,expression->address);
    if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 0xc)) {
      pEVar4 = (ExprBase *)0x0;
    }
    if (pEVar4 != (ExprBase *)0x0) {
      __s = pEVar4[1]._vptr_ExprBase;
      if (__s == (_func_int **)0x0) {
        __assert_fail("ptr->ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x700,
                      "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                     );
      }
      if (*(long *)&pEVar4[1].typeID - (long)__s != (ulong)*(uint *)(pTVar5[1]._vptr_TypeBase + 6))
      {
        __assert_fail("uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x701,
                      "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                     );
      }
      memset(__s,0,(ulong)*(uint *)(pTVar5[1]._vptr_TypeBase + 6));
      pAVar1 = ctx->ctx->allocator;
      iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
      pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar3);
      pSVar2 = (expression->super_ExprBase).source;
      pTVar5 = ctx->ctx->typeVoid;
      pEVar4->typeID = 2;
      pEVar4->source = pSVar2;
      pEVar4->type = pTVar5;
      pEVar4->next = (ExprBase *)0x0;
      pEVar4->listed = false;
      pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
      pEVar4 = CheckType(&expression->super_ExprBase,pEVar4);
      return pEVar4;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateZeroInitialize(ExpressionEvalContext &ctx, ExprZeroInitialize *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->address));

	if(!ptr)
		return NULL;

	assert(ptr->ptr);
	assert(uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size));

	memset(ptr->ptr, 0, unsigned(refType->subType->size));

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}